

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v8::detail::digit_grouping<wchar_t>::digit_grouping
          (digit_grouping<wchar_t> *this,locale_ref loc,bool localized)

{
  undefined3 in_register_00000011;
  undefined1 local_40 [40];
  
  (this->sep_).grouping._M_dataplus._M_p = (pointer)&(this->sep_).grouping.field_2;
  (this->sep_).grouping._M_string_length = 0;
  (this->sep_).grouping.field_2._M_local_buf[0] = '\0';
  if (CONCAT31(in_register_00000011,localized) == 0) {
    (this->sep_).thousands_sep = L'\0';
  }
  else {
    fmt::v8::detail::thousands_sep_impl<wchar_t>((locale_ref)local_40);
    detail::digit_grouping();
  }
  return;
}

Assistant:

explicit digit_grouping(locale_ref loc, bool localized = true) {
    if (localized)
      sep_ = thousands_sep<Char>(loc);
    else
      sep_.thousands_sep = Char();
  }